

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmul_template.h
# Opt level: O0

u32 crc32_x86_vpclmulqdq_avx2(u32 crc,u8 *p,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ulong uVar42;
  ulong uVar43;
  ulong in_RDX;
  ulong *in_RSI;
  uint in_EDI;
  undefined1 auVar44 [16];
  __m256i y0;
  size_t align;
  __m128i x1;
  __m128i x0;
  __m256i v7;
  __m256i v6;
  __m256i v5;
  __m256i v4;
  __m256i v3;
  __m256i v2;
  __m256i v1;
  __m256i v0;
  __m128i barrett_reduction_constants;
  __m128i mults_128b;
  __m256i mults_1v;
  __m256i mults_2v;
  __m256i mults_4v;
  __m256i mults_8v;
  size_t i;
  __m128i x1_2;
  __m128i x0_2;
  __m128i rshift_1;
  __m128i lshift_1;
  __m128i x1_1;
  __m128i x0_1;
  __m128i rshift;
  __m128i lshift;
  ulong local_3d88;
  ulong local_3d80;
  ulong local_3d40;
  ulong local_3d30;
  uint uStack_3d28;
  undefined4 uStack_3d24;
  ulong local_3b68;
  ulong *local_3b60;
  ulong local_3b50;
  ulong uStack_3b48;
  ulong local_3b30;
  ulong uStack_3b28;
  ulong local_3b10;
  ulong local_3af0;
  uint local_3ad4;
  ulong local_3ab0;
  ulong local_3aa0;
  ulong local_36a0;
  ulong uStack_3698;
  ulong local_3680;
  ulong uStack_3678;
  ulong local_3630;
  ulong uStack_3628;
  ulong local_3610;
  ulong uStack_3608;
  ulong local_35c0;
  ulong uStack_35b8;
  ulong local_35a0;
  ulong uStack_3598;
  ulong local_3550;
  ulong uStack_3548;
  ulong local_3530;
  ulong uStack_3528;
  ulong local_34e0;
  ulong uStack_34d8;
  ulong local_34c0;
  ulong uStack_34b8;
  ulong local_34a0;
  ulong uStack_3498;
  ulong local_3490;
  ulong uStack_3488;
  ulong local_3370;
  ulong uStack_3368;
  ulong local_3350;
  ulong uStack_3348;
  ulong local_3330;
  ulong uStack_3328;
  ulong local_3320;
  ulong uStack_3318;
  ulong local_3200;
  ulong uStack_31f8;
  ulong local_31e0;
  ulong uStack_31d8;
  
  vpunpcklqdq_avx(ZEXT816(0xce3371cb),ZEXT816(0xe95c1271));
  vpunpcklqdq_avx(ZEXT816(0xce3371cb),ZEXT816(0xe95c1271));
  vpunpcklqdq_avx(ZEXT816(0x33fff533),ZEXT816(0x910eeec1));
  vpunpcklqdq_avx(ZEXT816(0x33fff533),ZEXT816(0x910eeec1));
  vpunpcklqdq_avx(ZEXT816(0x8f352d95),ZEXT816(0x1d9513d7));
  vpunpcklqdq_avx(ZEXT816(0x8f352d95),ZEXT816(0x1d9513d7));
  vpunpcklqdq_avx(ZEXT816(0xf1da05aa),ZEXT816(0x81256527));
  vpunpcklqdq_avx(ZEXT816(0xf1da05aa),ZEXT816(0x81256527));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0xae689191),ZEXT816(0xccaa009e));
  local_3b30 = auVar2._0_8_;
  uStack_3b28 = auVar2._8_8_;
  auVar2 = vpunpcklqdq_avx(ZEXT816(0xb4e5b025f7011641),ZEXT816(0x1db710641));
  local_3b50 = auVar2._0_8_;
  uStack_3b48 = auVar2._8_8_;
  local_3b10 = CONCAT44(0,in_EDI);
  if (in_RDX < 0x100) {
    if (in_RDX < 0x20) {
      if (in_RDX < 0x10) {
        local_3ad4 = in_EDI;
        for (local_3af0 = 0; local_3af0 < in_RDX; local_3af0 = local_3af0 + 1) {
          local_3ad4 = local_3ad4 >> 8 ^
                       crc32_slice1_table
                       [(int)(local_3ad4 & 0xff ^ (uint)*(byte *)((long)in_RSI + local_3af0))];
        }
        return local_3ad4;
      }
      uVar43 = in_RSI[1];
      local_3d30 = *in_RSI ^ local_3b10;
      uStack_3d28 = (uint)uVar43;
      uStack_3d24 = (undefined4)(uVar43 >> 0x20);
      if (0x1f < in_RDX) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_3d30;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_3b30;
        auVar2 = (undefined1  [16])0x0;
        for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
          if ((auVar4 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
            auVar2 = auVar2 ^ auVar11 << uVar3;
          }
        }
        local_34c0 = auVar2._0_8_;
        uStack_34b8 = auVar2._8_8_;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar43;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uStack_3b28;
        auVar2 = (undefined1  [16])0x0;
        for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
          if ((auVar22 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
            auVar2 = auVar2 ^ auVar29 << uVar3;
          }
        }
        local_34e0 = auVar2._0_8_;
        uStack_34d8 = auVar2._8_8_;
        local_3d30 = in_RSI[2] ^ local_34c0 ^ local_34e0;
        uStack_34d8 = in_RSI[3] ^ uStack_34b8 ^ uStack_34d8;
        uStack_3d28 = (uint)uStack_34d8;
        uStack_3d24 = (undefined4)(uStack_34d8 >> 0x20);
        if (0x2f < in_RDX) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_3d30;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_3b30;
          auVar2 = (undefined1  [16])0x0;
          for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
            if ((auVar5 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
              auVar2 = auVar2 ^ auVar12 << uVar3;
            }
          }
          local_3530 = auVar2._0_8_;
          uStack_3528 = auVar2._8_8_;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uStack_34d8;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uStack_3b28;
          auVar2 = (undefined1  [16])0x0;
          for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
            if ((auVar23 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
              auVar2 = auVar2 ^ auVar30 << uVar3;
            }
          }
          local_3550 = auVar2._0_8_;
          uStack_3548 = auVar2._8_8_;
          local_3d30 = in_RSI[4] ^ local_3530 ^ local_3550;
          uStack_3548 = in_RSI[5] ^ uStack_3528 ^ uStack_3548;
          uStack_3d28 = (uint)uStack_3548;
          uStack_3d24 = (undefined4)(uStack_3548 >> 0x20);
        }
      }
      local_3b60 = (ulong *)((in_RDX & 0xfffffffffffffff0) + (long)in_RSI);
    }
    else {
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_3b10;
      local_3d80 = SUB168(ZEXT116(0) * (ZEXT816(0) << 0x20) + ZEXT116(1) * auVar38,0);
      local_3d80 = *in_RSI ^ local_3d80;
      if (0x3f < in_RDX) {
        if (in_RDX < 0x80) {
          halt_baddata();
        }
        halt_baddata();
      }
      local_3b60 = in_RSI + 4;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_3d80;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_3b30;
      auVar2 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar7 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ auVar14 << uVar3;
        }
      }
      local_3610 = auVar2._0_8_;
      uStack_3608 = auVar2._8_8_;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_3d80;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uStack_3b28;
      auVar2 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar26 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ auVar33 << uVar3;
        }
      }
      local_3630 = auVar2._0_8_;
      uStack_3628 = auVar2._8_8_;
      local_3d30 = local_3d80 ^ local_3610 ^ local_3630;
      uStack_3628 = local_3d80 ^ uStack_3608 ^ uStack_3628;
      uStack_3d28 = (uint)uStack_3628;
      uStack_3d24 = (undefined4)(uStack_3628 >> 0x20);
      if ((in_RDX & 0x10) != 0) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_3d30;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_3b30;
        auVar2 = (undefined1  [16])0x0;
        for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
          if ((auVar8 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
            auVar2 = auVar2 ^ auVar15 << uVar3;
          }
        }
        local_3680 = auVar2._0_8_;
        uStack_3678 = auVar2._8_8_;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uStack_3628;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uStack_3b28;
        auVar2 = (undefined1  [16])0x0;
        for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
          if ((auVar27 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
            auVar2 = auVar2 ^ auVar34 << uVar3;
          }
        }
        local_36a0 = auVar2._0_8_;
        uStack_3698 = auVar2._8_8_;
        local_3d30 = *local_3b60 ^ local_3680 ^ local_36a0;
        uStack_3698 = in_RSI[5] ^ uStack_3678 ^ uStack_3698;
        uStack_3d28 = (uint)uStack_3698;
        uStack_3d24 = (undefined4)(uStack_3698 >> 0x20);
        local_3b60 = in_RSI + 6;
      }
    }
    uVar43 = in_RDX & 0xf;
    if (uVar43 != 0) {
      auVar40._8_8_ = CONCAT44(uStack_3d24,uStack_3d28);
      auVar40._0_8_ = local_3d30;
      auVar1 = vpshufb_avx(auVar40,*(undefined1 (*) [16])(shift_tab + uVar43));
      auVar39._8_8_ = CONCAT44(uStack_3d24,uStack_3d28);
      auVar39._0_8_ = local_3d30;
      auVar2 = vpshufb_avx(auVar39,*(undefined1 (*) [16])(shift_tab + uVar43 + 0x10));
      auVar2 = vpblendvb_avx(auVar2,*(undefined1 (*) [16])((long)local_3b60 + (uVar43 - 0x10)),
                             *(undefined1 (*) [16])(shift_tab + uVar43 + 0x10));
      local_3490 = auVar1._0_8_;
      uStack_3488 = auVar1._8_8_;
      local_34a0 = auVar2._0_8_;
      uStack_3498 = auVar2._8_8_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_3490;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_3b30;
      auVar2 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar9 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ auVar16 << uVar3;
        }
      }
      local_3350 = auVar2._0_8_;
      uStack_3348 = auVar2._8_8_;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uStack_3488;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uStack_3b28;
      auVar2 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar28 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ auVar35 << uVar3;
        }
      }
      local_3370 = auVar2._0_8_;
      uStack_3368 = auVar2._8_8_;
      local_3d30 = local_34a0 ^ local_3350 ^ local_3370;
      uStack_3368 = uStack_3498 ^ uStack_3348 ^ uStack_3368;
      uStack_3d28 = (uint)uStack_3368;
      uStack_3d24 = (undefined4)(uStack_3368 >> 0x20);
    }
    auVar37._8_4_ = uStack_3d28;
    auVar37._0_8_ = local_3d30;
    auVar37._12_4_ = uStack_3d24;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_3d30;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uStack_3b28;
    auVar2 = (undefined1  [16])0x0;
    for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
      if ((auVar18 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
        auVar2 = auVar2 ^ auVar20 << uVar3;
      }
    }
    auVar44 = vpsrldq_avx(auVar37,8);
    local_3aa0 = auVar2._0_8_;
    local_3ab0 = auVar44._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_3aa0 ^ local_3ab0;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_3b50;
    auVar1 = (undefined1  [16])0x0;
    for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
      if ((auVar10 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
        auVar1 = auVar1 ^ auVar17 << uVar3;
      }
    }
    local_3d40 = auVar1._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_3d40;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uStack_3b48;
    auVar1 = (undefined1  [16])0x0;
    for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
      if ((auVar19 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
        auVar1 = auVar1 ^ auVar21 << uVar3;
      }
    }
    uStack_3d28 = auVar2._8_4_ ^ auVar44._8_4_ ^ auVar1._8_4_;
    return uStack_3d28;
  }
  local_3b68 = in_RDX;
  if ((0x10000 < in_RDX) && (((ulong)in_RSI & 0x1f) != 0)) {
    uVar43 = -(long)in_RSI;
    local_3d88 = uVar43 & 0x1f;
    local_3b68 = in_RDX - local_3d88;
    uVar36 = in_RSI[1];
    local_3d30 = *in_RSI ^ local_3b10;
    uStack_3d28 = (uint)uVar36;
    uStack_3d24 = (undefined4)(uVar36 >> 0x20);
    local_3b60 = in_RSI + 2;
    if ((uVar43 & 0xf) != 0) {
      uVar42 = uVar43 & 0xf;
      auVar41._8_8_ = uVar36;
      auVar41._0_8_ = local_3d30;
      auVar1 = vpshufb_avx(auVar41,*(undefined1 (*) [16])(shift_tab + uVar42));
      auVar2._8_8_ = uVar36;
      auVar2._0_8_ = local_3d30;
      auVar2 = vpshufb_avx(auVar2,*(undefined1 (*) [16])(shift_tab + uVar42 + 0x10));
      auVar2 = vpblendvb_avx(auVar2,*(undefined1 (*) [16])((long)local_3b60 + (uVar42 - 0x10)),
                             *(undefined1 (*) [16])(shift_tab + uVar42 + 0x10));
      local_3320 = auVar1._0_8_;
      uStack_3318 = auVar1._8_8_;
      local_3330 = auVar2._0_8_;
      uStack_3328 = auVar2._8_8_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_3320;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_3b30;
      auVar2 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar1 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ auVar44 << uVar3;
        }
      }
      local_31e0 = auVar2._0_8_;
      uStack_31d8 = auVar2._8_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uStack_3318;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uStack_3b28;
      auVar2 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar24 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ auVar31 << uVar3;
        }
      }
      local_3200 = auVar2._0_8_;
      uStack_31f8 = auVar2._8_8_;
      local_3d30 = local_3330 ^ local_31e0 ^ local_3200;
      uStack_31f8 = uStack_3328 ^ uStack_31d8 ^ uStack_31f8;
      uStack_3d28 = (uint)uStack_31f8;
      uStack_3d24 = (undefined4)(uStack_31f8 >> 0x20);
      local_3b60 = (ulong *)((uVar43 & 0xf) + (long)local_3b60);
      local_3d88 = uVar43 & 0x10;
    }
    for (; local_3d88 != 0; local_3d88 = local_3d88 - 0x10) {
      auVar25._4_4_ = uStack_3d24;
      auVar25._0_4_ = uStack_3d28;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_3d30;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_3b30;
      auVar2 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar6 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ auVar13 << uVar3;
        }
      }
      local_35a0 = auVar2._0_8_;
      uStack_3598 = auVar2._8_8_;
      auVar25._8_8_ = 0;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uStack_3b28;
      auVar2 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar25 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ auVar32 << uVar3;
        }
      }
      local_35c0 = auVar2._0_8_;
      uStack_35b8 = auVar2._8_8_;
      local_3d30 = *local_3b60 ^ local_35a0 ^ local_35c0;
      uStack_35b8 = local_3b60[1] ^ uStack_3598 ^ uStack_35b8;
      uStack_3d28 = (uint)uStack_35b8;
      uStack_3d24 = (undefined4)(uStack_35b8 >> 0x20);
      local_3b60 = local_3b60 + 2;
    }
  }
  if (0x1ff < local_3b68) {
    halt_baddata();
  }
  halt_baddata();
}

Assistant:

static ATTRIBUTES u32
ADD_SUFFIX(crc32_x86)(u32 crc, const u8 *p, size_t len)
{
	/*
	 * mults_{N}v are the vectors of multipliers for folding across N vec_t
	 * vectors, i.e. N*VL*8 bits.  mults_128b are the two multipliers for
	 * folding across 128 bits.  mults_128b differs from mults_1v when
	 * VL != 16.  All multipliers are 64-bit, to match what pclmulqdq needs,
	 * but since this is for CRC-32 only their low 32 bits are nonzero.
	 * For more details, see scripts/gen-crc32-consts.py.
	 */
	const vec_t mults_8v = MULTS_8V;
	const vec_t mults_4v = MULTS_4V;
	const vec_t mults_2v = MULTS_2V;
	const vec_t mults_1v = MULTS_1V;
	const __m128i mults_128b = _mm_set_epi64x(CRC32_X95_MODG, CRC32_X159_MODG);
	const __m128i barrett_reduction_constants =
		_mm_set_epi64x(CRC32_BARRETT_CONSTANT_2, CRC32_BARRETT_CONSTANT_1);
	vec_t v0, v1, v2, v3, v4, v5, v6, v7;
	__m128i x0 = _mm_cvtsi32_si128(crc);
	__m128i x1;

	if (len < 8*VL) {
		if (len < VL) {
			STATIC_ASSERT(VL == 16 || VL == 32 || VL == 64);
			if (len < 16) {
			#if USE_AVX512
				if (len < 4)
					return crc32_slice1(crc, p, len);
				/*
				 * Handle 4 <= len <= 15 bytes by doing a masked
				 * load, XOR'ing the current CRC with the first
				 * 4 bytes, left-shifting by '16 - len' bytes to
				 * align the result to the end of x0 (so that it
				 * becomes the low-order coefficients of a
				 * 128-bit polynomial), and then doing the usual
				 * reduction from 128 bits to 32 bits.
				 */
				x0 = _mm_xor_si128(
					x0, _mm_maskz_loadu_epi8((1 << len) - 1, p));
				x0 = _mm_shuffle_epi8(
					x0, _mm_loadu_si128((const void *)&shift_tab[len]));
				goto reduce_x0;
			#else
				return crc32_slice1(crc, p, len);
			#endif
			}
			/*
			 * Handle 16 <= len < VL bytes where VL is 32 or 64.
			 * Use 128-bit instructions so that these lengths aren't
			 * slower with VL > 16 than with VL=16.
			 */
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			if (len >= 32) {
				x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 16)),
						 mults_128b);
				if (len >= 48)
					x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 32)),
							 mults_128b);
			}
			p += len & ~15;
			goto less_than_16_remaining;
		}
		v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		if (len < 2*VL) {
			p += VL;
			goto less_than_vl_remaining;
		}
		v1 = VLOADU(p + 1*VL);
		if (len < 4*VL) {
			p += 2*VL;
			goto less_than_2vl_remaining;
		}
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		p += 4*VL;
	} else {
		/*
		 * If the length is large and the pointer is misaligned, align
		 * it.  For smaller lengths, just take the misaligned load
		 * penalty.  Note that on recent x86 CPUs, vmovdqu with an
		 * aligned address is just as fast as vmovdqa, so there's no
		 * need to use vmovdqa in the main loop.
		 */
		if (len > 65536 && ((uintptr_t)p & (VL-1))) {
			size_t align = -(uintptr_t)p & (VL-1);

			len -= align;
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			p += 16;
			if (align & 15) {
				x0 = fold_lessthan16bytes(x0, p, align & 15,
							  mults_128b);
				p += align & 15;
				align &= ~15;
			}
			while (align) {
				x0 = fold_vec128(x0, *(const __m128i *)p,
						 mults_128b);
				p += 16;
				align -= 16;
			}
			v0 = M128I_TO_VEC(x0);
		#  if VL == 32
			v0 = _mm256_inserti128_si256(v0, *(const __m128i *)p, 1);
		#  elif VL == 64
			v0 = _mm512_inserti32x4(v0, *(const __m128i *)p, 1);
			v0 = _mm512_inserti64x4(v0, *(const __m256i *)(p + 16), 1);
		#  endif
			p -= 16;
		} else {
			v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		}
		v1 = VLOADU(p + 1*VL);
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		v4 = VLOADU(p + 4*VL);
		v5 = VLOADU(p + 5*VL);
		v6 = VLOADU(p + 6*VL);
		v7 = VLOADU(p + 7*VL);
		p += 8*VL;

		/*
		 * This is the main loop, processing 8*VL bytes per iteration.
		 * 4*VL is usually enough and would result in smaller code, but
		 * Skylake and Cascade Lake need 8*VL to get full performance.
		 */
		while (len >= 16*VL) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_8v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_8v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_8v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_8v);
			v4 = fold_vec(v4, VLOADU(p + 4*VL), mults_8v);
			v5 = fold_vec(v5, VLOADU(p + 5*VL), mults_8v);
			v6 = fold_vec(v6, VLOADU(p + 6*VL), mults_8v);
			v7 = fold_vec(v7, VLOADU(p + 7*VL), mults_8v);
			p += 8*VL;
			len -= 8*VL;
		}

		/* Fewer than 8*VL bytes remain. */
		v0 = fold_vec(v0, v4, mults_4v);
		v1 = fold_vec(v1, v5, mults_4v);
		v2 = fold_vec(v2, v6, mults_4v);
		v3 = fold_vec(v3, v7, mults_4v);
		if (len & (4*VL)) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_4v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_4v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_4v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_4v);
			p += 4*VL;
		}
	}
	/* Fewer than 4*VL bytes remain. */
	v0 = fold_vec(v0, v2, mults_2v);
	v1 = fold_vec(v1, v3, mults_2v);
	if (len & (2*VL)) {
		v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_2v);
		v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_2v);
		p += 2*VL;
	}
less_than_2vl_remaining:
	/* Fewer than 2*VL bytes remain. */
	v0 = fold_vec(v0, v1, mults_1v);
	if (len & VL) {
		v0 = fold_vec(v0, VLOADU(p), mults_1v);
		p += VL;
	}
less_than_vl_remaining:
	/*
	 * Fewer than VL bytes remain.  Reduce v0 (length VL bytes) to x0
	 * (length 16 bytes) and fold in any 16-byte data segments that remain.
	 */
#if VL == 16
	x0 = v0;
#else
	{
	#if VL == 32
		__m256i y0 = v0;
	#else
		const __m256i mults_256b =
			_mm256_set_epi64x(CRC32_X223_MODG, CRC32_X287_MODG,
					  CRC32_X223_MODG, CRC32_X287_MODG);
		__m256i y0 = fold_vec256(_mm512_extracti64x4_epi64(v0, 0),
					 _mm512_extracti64x4_epi64(v0, 1),
					 mults_256b);
		if (len & 32) {
			y0 = fold_vec256(y0, _mm256_loadu_si256((const void *)p),
					 mults_256b);
			p += 32;
		}
	#endif
		x0 = fold_vec128(_mm256_extracti128_si256(y0, 0),
				 _mm256_extracti128_si256(y0, 1), mults_128b);
	}
	if (len & 16) {
		x0 = fold_vec128(x0, _mm_loadu_si128((const void *)p),
				 mults_128b);
		p += 16;
	}
#endif
less_than_16_remaining:
	len &= 15;

	/* Handle any remainder of 1 to 15 bytes. */
	if (len)
		x0 = fold_lessthan16bytes(x0, p, len, mults_128b);
#if USE_AVX512
reduce_x0:
#endif
	/*
	 * Multiply the remaining 128-bit message polynomial 'x0' by x^32, then
	 * reduce it modulo the generator polynomial G.  This gives the CRC.
	 *
	 * This implementation matches that used in crc-pclmul-template.S from
	 * https://lore.kernel.org/r/20250210174540.161705-4-ebiggers@kernel.org/
	 * with the parameters n=32 and LSB_CRC=1 (what the gzip CRC uses).  See
	 * there for a detailed explanation of the math used here.
	 */
	x0 = _mm_xor_si128(_mm_clmulepi64_si128(x0, mults_128b, 0x10),
			   _mm_bsrli_si128(x0, 8));
	x1 = _mm_clmulepi64_si128(x0, barrett_reduction_constants, 0x00);
	x1 = _mm_clmulepi64_si128(x1, barrett_reduction_constants, 0x10);
	x0 = _mm_xor_si128(x0, x1);
	return _mm_extract_epi32(x0, 2);
}